

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeElementSegments(WasmBinaryWriter *this)

{
  Module *wasm;
  pointer puVar1;
  ElementSegment *pEVar2;
  char *pcVar3;
  pointer ppEVar4;
  BufferWithRandomAccess *pBVar5;
  U32LEB x;
  bool bVar6;
  int32_t start;
  U32LEB UVar7;
  Table *pTVar8;
  RefFunc *pRVar9;
  mapped_type *pmVar10;
  uint uVar11;
  pointer puVar12;
  uint uVar13;
  long lVar14;
  iterator __begin3;
  pointer ppEVar15;
  bool bVar16;
  undefined1 local_98 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> needingElemDecl;
  Name name;
  Type funcref;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  
  wasm = this->wasm;
  puVar12 = (wasm->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  TableUtils::getFunctionsNeedingElemDeclare
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)local_98,wasm);
  lVar14 = (ulong)(CONCAT44(needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
                            _4_4_,needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_right._0_4_) != 0) + ((long)puVar12 - (long)puVar1 >> 3);
  if (lVar14 != 0) {
    start = startSection<wasm::BinaryConsts::Section>(this,Element);
    BufferWithRandomAccess::operator<<(this->o,(U32LEB)(uint)lVar14);
    wasm::Type::Type((Type *)&name.super_IString.str._M_str,(HeapType)0x10,Nullable,Inexact);
    puVar1 = (this->wasm->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (this->wasm->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar1;
        puVar12 = puVar12 + 1) {
      pEVar2 = (puVar12->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      pcVar3 = *(char **)((long)&(pEVar2->table).super_IString + 8);
      bVar6 = TableUtils::usesExpressions(pEVar2,this->wasm);
      uVar13 = (uint)bVar6;
      if (pcVar3 == (char *)0x0) {
        uVar11 = uVar13 << 2;
        UVar7.value = 0;
        bVar16 = false;
        uVar13 = uVar11;
      }
      else {
        UVar7.value = getTableIndex(this,(Name)(((puVar12->_M_t).
                                                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                                 .
                                                 super__Head_base<0UL,_wasm::ElementSegment_*,_false>
                                                ._M_head_impl)->table).super_IString.str);
        if (UVar7.value == 0) {
          pTVar8 = Module::getTable(this->wasm,
                                    (Name)(((puVar12->_M_t).
                                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                           _M_head_impl)->table).super_IString.str);
          bVar16 = (char *)(pTVar8->type).id != name.super_IString.str._M_str;
          uVar11 = uVar13 * 4 + 2;
          if (!bVar16) {
            uVar11 = uVar13 * 4;
          }
          UVar7.value = 0;
          uVar13 = uVar13 * 4;
        }
        else {
          uVar11 = (uint)bVar6 * 4 + 2;
          bVar16 = true;
          uVar13 = uVar13 << 2;
        }
      }
      x.value = uVar13 | 1;
      if (pcVar3 != (char *)0x0) {
        x.value = uVar11;
      }
      BufferWithRandomAccess::operator<<(this->o,x);
      if (pcVar3 == (char *)0x0) {
LAB_00cbd749:
        if (bVar6) {
          writeType(this,(Type)(((puVar12->_M_t).
                                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)
                               ->type).id);
        }
        else {
          BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x0);
        }
      }
      else {
        if (bVar16) {
          BufferWithRandomAccess::operator<<(this->o,UVar7);
        }
        writeExpression(this,((puVar12->_M_t).
                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                             offset);
        BufferWithRandomAccess::operator<<(this->o,'\v');
        if (bVar16) goto LAB_00cbd749;
      }
      pEVar2 = (puVar12->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      BufferWithRandomAccess::operator<<
                (this->o,(U32LEB)(uint)((ulong)((long)*(pointer *)
                                                       ((long)&(pEVar2->data).
                                                                                                                              
                                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  + 8) - *(long *)&(pEVar2->data).
                                                                                                                                      
                                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  ._M_impl) >> 3));
      pEVar2 = (puVar12->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      ppEVar15 = *(pointer *)
                  &(pEVar2->data).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl;
      ppEVar4 = *(pointer *)
                 ((long)&(pEVar2->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                 + 8);
      if (bVar6) {
        for (; ppEVar15 != ppEVar4; ppEVar15 = ppEVar15 + 1) {
          writeExpression(this,*ppEVar15);
          BufferWithRandomAccess::operator<<(this->o,'\v');
        }
      }
      else {
        for (; ppEVar15 != ppEVar4; ppEVar15 = ppEVar15 + 1) {
          pRVar9 = Expression::cast<wasm::RefFunc>(*ppEVar15);
          pBVar5 = this->o;
          UVar7.value = getFunctionIndex(this,(Name)(pRVar9->func).super_IString.str);
          BufferWithRandomAccess::operator<<(pBVar5,UVar7);
        }
      }
    }
    if (CONCAT44(needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,
                 needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_) != 0)
    {
      BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x3);
      BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x0);
      BufferWithRandomAccess::operator<<
                (this->o,needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
                );
      for (; needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
             (_Rb_tree_node_base *)&needingElemDecl;
          needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               std::_Rb_tree_increment
                         (needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)) {
        needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count =
             *(size_t *)(needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1)
        ;
        name.super_IString.str._M_len =
             (size_t)needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1].
                     _M_parent;
        pBVar5 = this->o;
        pmVar10 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->indexes,
                               (key_type *)
                               &needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count);
        BufferWithRandomAccess::operator<<(pBVar5,(U32LEB)*pmVar10);
      }
    }
    finishSection(this,start);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_98);
  return;
}

Assistant:

void WasmBinaryWriter::writeElementSegments() {
  size_t elemCount = wasm->elementSegments.size();
  auto needingElemDecl = TableUtils::getFunctionsNeedingElemDeclare(*wasm);
  if (!needingElemDecl.empty()) {
    elemCount++;
  }
  if (elemCount == 0) {
    return;
  }

  auto start = startSection(BinaryConsts::Section::Element);
  o << U32LEB(elemCount);

  Type funcref = Type(HeapType::func, Nullable);
  for (auto& segment : wasm->elementSegments) {
    Index tableIdx = 0;

    bool isPassive = segment->table.isNull();
    // If the segment is MVP, we can use the shorter form.
    bool usesExpressions = TableUtils::usesExpressions(segment.get(), wasm);

    // The table index can and should be elided for active segments of table 0
    // when table 0 has type funcref. This was the only type of segment
    // supported by the MVP, which also did not support table indices in the
    // segment encoding.
    bool hasTableIndex = false;
    if (!isPassive) {
      tableIdx = getTableIndex(segment->table);
      hasTableIndex =
        tableIdx > 0 || wasm->getTable(segment->table)->type != funcref;
    }

    uint32_t flags = 0;
    if (usesExpressions) {
      flags |= BinaryConsts::UsesExpressions;
    }
    if (isPassive) {
      flags |= BinaryConsts::IsPassive;
    } else if (hasTableIndex) {
      flags |= BinaryConsts::HasIndex;
    }

    o << U32LEB(flags);
    if (!isPassive) {
      if (hasTableIndex) {
        o << U32LEB(tableIdx);
      }
      writeExpression(segment->offset);
      o << int8_t(BinaryConsts::End);
    }

    if (isPassive || hasTableIndex) {
      if (usesExpressions) {
        // elemType
        writeType(segment->type);
      } else {
        // MVP elemKind of funcref
        o << U32LEB(0);
      }
    }
    o << U32LEB(segment->data.size());
    if (usesExpressions) {
      for (auto* item : segment->data) {
        writeExpression(item);
        o << int8_t(BinaryConsts::End);
      }
    } else {
      for (auto& item : segment->data) {
        // We've ensured that all items are ref.func.
        auto& name = item->cast<RefFunc>()->func;
        o << U32LEB(getFunctionIndex(name));
      }
    }
  }

  if (!needingElemDecl.empty()) {
    o << U32LEB(BinaryConsts::IsPassive | BinaryConsts::IsDeclarative);
    o << U32LEB(0); // type (indicating funcref)
    o << U32LEB(needingElemDecl.size());
    for (auto name : needingElemDecl) {
      o << U32LEB(indexes.functionIndexes[name]);
    }
  }

  finishSection(start);
}